

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadUInt(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
           *this,uint lb,uint ub)

{
  uint in_EDX;
  uint in_ESI;
  TextReader<fmt::Locale> *in_RDI;
  CStringRef unaff_retaddr;
  uint unsigned_value;
  int value;
  BasicCStringRef<char> local_20;
  uint local_18;
  uint local_14;
  
  local_18 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x4cc923);
  local_14 = local_18;
  if ((local_18 < in_ESI) || (in_EDX <= local_18)) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_20,"integer {} out of bounds");
    TextReader<fmt::Locale>::ReportError<int>(in_RDI,unaff_retaddr,(int *)CONCAT44(in_ESI,in_EDX));
  }
  return local_14;
}

Assistant:

int ReadUInt(unsigned lb, unsigned ub) {
    int value = reader_.ReadUInt();
    unsigned unsigned_value = value;
    if (unsigned_value < lb || unsigned_value >= ub)
      reader_.ReportError("integer {} out of bounds", value);
    return value;
  }